

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sndio.cpp
# Opt level: O2

bool __thiscall anon_unknown.dwarf_265da4::SndioPlayback::reset(SndioPlayback *this)

{
  pointer pbVar1;
  FILE *__stream;
  int iVar2;
  ALCdevice *pAVar3;
  pointer pbVar4;
  ALCchar *pAVar5;
  char *pcVar6;
  DevFmtChannels DVar7;
  bool bVar8;
  DevFmtType DVar9;
  uint uVar10;
  uint local_60;
  int local_5c;
  uint local_58;
  int local_54;
  uint local_48;
  ALuint local_44;
  int local_40;
  ALuint local_38;
  ALuint local_34;
  
  sio_initpar(&local_60);
  pAVar3 = (this->super_BackendBase).mDevice;
  local_44 = pAVar3->Frequency;
  if ((ulong)pAVar3->FmtChans < 8) {
    local_48 = *(uint *)(&DAT_0018b9a4 + (ulong)pAVar3->FmtChans * 4);
  }
  uVar10 = 1;
  switch(pAVar3->FmtType) {
  case DevFmtByte:
    local_60 = 8;
    local_58 = uVar10;
    break;
  case DevFmtUByte:
    local_60 = 8;
    goto LAB_0015e642;
  case DevFmtShort:
  case DevFmtFloat:
    local_60 = 0x10;
    local_58 = uVar10;
    break;
  case DevFmtUShort:
    local_60 = 0x10;
    goto LAB_0015e642;
  case DevFmtInt:
    local_60 = 0x20;
    local_58 = uVar10;
    break;
  case DevFmtUInt:
    local_60 = 0x20;
LAB_0015e642:
    local_58 = 0;
  }
  local_54 = 1;
  local_38 = pAVar3->UpdateSize;
  local_34 = pAVar3->BufferSize - local_38;
  if (local_34 == 0) {
    local_34 = local_38;
  }
  iVar2 = sio_setpar(this->mSndHandle);
  if ((iVar2 == 0) ||
     (iVar2 = sio_getpar(this->mSndHandle,&local_60), uVar10 = local_48, iVar2 == 0)) {
    if (0 < (int)gLogLevel) {
      fwrite("[ALSOFT] (EE) Failed to set device parameters\n",0x2e,1,(FILE *)gLogFile);
    }
LAB_0015e73e:
    bVar8 = false;
  }
  else {
    if (local_60 != local_5c << 3) {
      if (0 < (int)gLogLevel) {
        fprintf((FILE *)gLogFile,"[ALSOFT] (EE) Padded samples not supported (%u of %u bits)\n");
        return false;
      }
      goto LAB_0015e73e;
    }
    if (local_54 != 1) {
      if (0 < (int)gLogLevel) {
        pcVar6 = "little";
        if (local_54 == 0) {
          pcVar6 = "big";
        }
        fprintf((FILE *)gLogFile,
                "[ALSOFT] (EE) Non-native-endian samples not supported (got %s-endian)\n",pcVar6);
        return false;
      }
      goto LAB_0015e73e;
    }
    pAVar3 = (this->super_BackendBase).mDevice;
    pAVar3->Frequency = local_44;
    __stream = gLogFile;
    if (local_48 < 2) {
      if (pAVar3->FmtChans == DevFmtMono) goto LAB_0015e7a9;
      if (1 < (int)gLogLevel) {
        pAVar5 = DevFmtChannelsString(pAVar3->FmtChans);
        pcVar6 = "[ALSOFT] (WW) Got %u channel for %s\n";
        DVar7 = DevFmtMono;
        goto LAB_0015e987;
      }
      DVar7 = DevFmtMono;
    }
    else {
      switch(local_48) {
      case 2:
        if (pAVar3->FmtChans != DevFmtChannelsDefault) break;
        goto LAB_0015e7a9;
      case 4:
        if (pAVar3->FmtChans == DevFmtQuad) goto LAB_0015e7a9;
        break;
      case 6:
        if ((pAVar3->FmtChans | DevFmtX61) == DevFmtX51Rear) goto LAB_0015e7a9;
        break;
      case 7:
        if (pAVar3->FmtChans == DevFmtX61) goto LAB_0015e7a9;
        break;
      case 8:
        if (pAVar3->FmtChans == DevFmtX71) goto LAB_0015e7a9;
      }
      DVar7 = DevFmtChannelsDefault;
      if (1 < (int)gLogLevel) {
        pAVar5 = DevFmtChannelsString(pAVar3->FmtChans);
        pcVar6 = "[ALSOFT] (WW) Got %u channels for %s\n";
LAB_0015e987:
        fprintf((FILE *)__stream,pcVar6,(ulong)uVar10,pAVar5);
        pAVar3 = (this->super_BackendBase).mDevice;
      }
    }
    pAVar3->FmtChans = DVar7;
LAB_0015e7a9:
    uVar10 = local_58 ^ 1;
    if ((local_60 ^ 8) == 0 && uVar10 == 0) {
      DVar9 = DevFmtByte;
    }
    else {
      DVar9 = DevFmtUByte;
      if ((local_60 ^ 8) != 0 || local_58 != 0) {
        DVar9 = DevFmtShort;
        if (((local_60 ^ 0x10) != 0 || uVar10 != 0) &&
           (DVar9 = DevFmtUShort, (local_60 ^ 0x10) != 0 || local_58 != 0)) {
          DVar9 = DevFmtInt;
          if ((uVar10 != 0 || (local_60 ^ 0x20) != 0) &&
             (DVar9 = DevFmtUInt, (local_60 ^ 0x20) != 0 || local_58 != 0)) {
            if (0 < (int)gLogLevel) {
              pcVar6 = "signed";
              if (local_58 == 0) {
                pcVar6 = "unsigned";
              }
              fprintf((FILE *)gLogFile,"[ALSOFT] (EE) Unhandled sample format: %s %u-bit\n",pcVar6);
              return false;
            }
            goto LAB_0015e73e;
          }
        }
      }
    }
    pAVar3->FmtType = DVar9;
    BackendBase::setDefaultChannelOrder(&this->super_BackendBase);
    pAVar3 = (this->super_BackendBase).mDevice;
    pAVar3->UpdateSize = local_38;
    pAVar3->BufferSize = local_40 + local_38;
    std::vector<al::byte,_al::allocator<al::byte,_1UL>_>::resize
              (&this->mBuffer,(ulong)(local_38 * local_48 * local_5c));
    if (local_58 == 1) {
      pbVar1 = (this->mBuffer).super__Vector_base<al::byte,_al::allocator<al::byte,_1UL>_>._M_impl.
               super__Vector_impl_data._M_finish;
      for (pbVar4 = (this->mBuffer).super__Vector_base<al::byte,_al::allocator<al::byte,_1UL>_>.
                    _M_impl.super__Vector_impl_data._M_start; pbVar4 != pbVar1; pbVar4 = pbVar4 + 1)
      {
        *pbVar4 = 0;
      }
      bVar8 = true;
    }
    else {
      bVar8 = true;
      if (local_60 == 0x20) {
        pbVar4 = (this->mBuffer).super__Vector_base<al::byte,_al::allocator<al::byte,_1UL>_>._M_impl
                 .super__Vector_impl_data._M_start;
        std::__fill_n_a<unsigned_int*,unsigned_long,unsigned_int>
                  (pbVar4,(ulong)((long)(this->mBuffer).
                                        super__Vector_base<al::byte,_al::allocator<al::byte,_1UL>_>.
                                        _M_impl.super__Vector_impl_data._M_finish - (long)pbVar4) >>
                          2);
      }
      else if (local_60 == 0x10) {
        pbVar4 = (this->mBuffer).super__Vector_base<al::byte,_al::allocator<al::byte,_1UL>_>._M_impl
                 .super__Vector_impl_data._M_start;
        std::__fill_n_a<unsigned_short*,unsigned_long,int>
                  (pbVar4,(ulong)((long)(this->mBuffer).
                                        super__Vector_base<al::byte,_al::allocator<al::byte,_1UL>_>.
                                        _M_impl.super__Vector_impl_data._M_finish - (long)pbVar4) >>
                          1);
      }
      else if (local_60 == 8) {
        pbVar4 = (this->mBuffer).super__Vector_base<al::byte,_al::allocator<al::byte,_1UL>_>._M_impl
                 .super__Vector_impl_data._M_start;
        std::__fill_n_a<al::byte*,unsigned_long,al::byte>
                  (pbVar4,(long)(this->mBuffer).
                                super__Vector_base<al::byte,_al::allocator<al::byte,_1UL>_>._M_impl.
                                super__Vector_impl_data._M_finish - (long)pbVar4);
      }
    }
  }
  return bVar8;
}

Assistant:

bool SndioPlayback::reset()
{
    sio_par par;
    sio_initpar(&par);

    par.rate = mDevice->Frequency;
    switch(mDevice->FmtChans)
    {
    case DevFmtMono   : par.pchan = 1; break;
    case DevFmtQuad   : par.pchan = 4; break;
    case DevFmtX51Rear: // fall-through - "Similar to 5.1, except using rear channels instead of sides"
    case DevFmtX51    : par.pchan = 6; break;
    case DevFmtX61    : par.pchan = 7; break;
    case DevFmtX71    : par.pchan = 8; break;

    // fall back to stereo for Ambi3D
    case DevFmtAmbi3D : // fall-through
    case DevFmtStereo : par.pchan = 2; break;
    }

    switch(mDevice->FmtType)
    {
    case DevFmtByte:
        par.bits = 8;
        par.sig = 1;
        break;
    case DevFmtUByte:
        par.bits = 8;
        par.sig = 0;
        break;
    case DevFmtFloat:
    case DevFmtShort:
        par.bits = 16;
        par.sig = 1;
        break;
    case DevFmtUShort:
        par.bits = 16;
        par.sig = 0;
        break;
    case DevFmtInt:
        par.bits = 32;
        par.sig = 1;
        break;
    case DevFmtUInt:
        par.bits = 32;
        par.sig = 0;
        break;
    }
    par.le = SIO_LE_NATIVE;

    par.round = mDevice->UpdateSize;
    par.appbufsz = mDevice->BufferSize - mDevice->UpdateSize;
    if(!par.appbufsz) par.appbufsz = mDevice->UpdateSize;

    if(!sio_setpar(mSndHandle, &par) || !sio_getpar(mSndHandle, &par))
    {
        ERR("Failed to set device parameters\n");
        return false;
    }

    if(par.bits != par.bps*8)
    {
        ERR("Padded samples not supported (%u of %u bits)\n", par.bits, par.bps*8);
        return false;
    }
    if(par.le != SIO_LE_NATIVE)
    {
        ERR("Non-native-endian samples not supported (got %s-endian)\n",
            par.le ? "little" : "big");
        return false;
    }

    mDevice->Frequency = par.rate;

    if(par.pchan < 2)
    {
        if(mDevice->FmtChans != DevFmtMono)
        {
            WARN("Got %u channel for %s\n", par.pchan, DevFmtChannelsString(mDevice->FmtChans));
            mDevice->FmtChans = DevFmtMono;
        }
    }
    else if((par.pchan == 2 && mDevice->FmtChans != DevFmtStereo)
        || par.pchan == 3
        || (par.pchan == 4 && mDevice->FmtChans != DevFmtQuad)
        || par.pchan == 5
        || (par.pchan == 6 && mDevice->FmtChans != DevFmtX51 && mDevice->FmtChans != DevFmtX51Rear)
        || (par.pchan == 7 && mDevice->FmtChans != DevFmtX61)
        || (par.pchan == 8 && mDevice->FmtChans != DevFmtX71)
        || par.pchan > 8)
    {
        WARN("Got %u channels for %s\n", par.pchan, DevFmtChannelsString(mDevice->FmtChans));
        mDevice->FmtChans = DevFmtStereo;
    }

    if(par.bits == 8 && par.sig == 1)
        mDevice->FmtType = DevFmtByte;
    else if(par.bits == 8 && par.sig == 0)
        mDevice->FmtType = DevFmtUByte;
    else if(par.bits == 16 && par.sig == 1)
        mDevice->FmtType = DevFmtShort;
    else if(par.bits == 16 && par.sig == 0)
        mDevice->FmtType = DevFmtUShort;
    else if(par.bits == 32 && par.sig == 1)
        mDevice->FmtType = DevFmtInt;
    else if(par.bits == 32 && par.sig == 0)
        mDevice->FmtType = DevFmtUInt;
    else
    {
        ERR("Unhandled sample format: %s %u-bit\n", (par.sig?"signed":"unsigned"), par.bits);
        return false;
    }

    setDefaultChannelOrder();

    mDevice->UpdateSize = par.round;
    mDevice->BufferSize = par.bufsz + par.round;

    mBuffer.resize(mDevice->UpdateSize * par.pchan*par.bps);
    if(par.sig == 1)
        std::fill(mBuffer.begin(), mBuffer.end(), al::byte{});
    else if(par.bits == 8)
        std::fill_n(mBuffer.data(), mBuffer.size(), al::byte(0x80));
    else if(par.bits == 16)
        std::fill_n(reinterpret_cast<uint16_t*>(mBuffer.data()), mBuffer.size()/2, 0x8000);
    else if(par.bits == 32)
        std::fill_n(reinterpret_cast<uint32_t*>(mBuffer.data()), mBuffer.size()/4, 0x80000000u);

    return true;
}